

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemRecord.cpp
# Opt level: O2

void * operator_new__(size_t nSize,char *fileName,int lineName)

{
  void *ptr;
  MemRecordMap *this;
  ostream *poVar1;
  allocator local_49;
  string local_48;
  
  ptr = malloc(nSize);
  this = MemRecordMap::getInstance();
  std::__cxx11::string::string((string *)&local_48,fileName,&local_49);
  MemRecordMap::insertMap(this,ptr,&local_48,lineName);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"call new[]");
  std::endl<char,std::char_traits<char>>(poVar1);
  return ptr;
}

Assistant:

void* operator new[](size_t nSize , char* fileName , int lineName){
    void* ptr = malloc(nSize);
    MemRecordMap::getInstance()->insertMap(ptr,fileName,lineName);
    std::cout<<"call new[]"<<std::endl;
    return ptr;
}